

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O1

double aom_compute_correlation_c
                 (uchar *frame1,int stride1,int x1,int y1,double mean1,double one_over_stddev1,
                 uchar *frame2,int stride2,int x2,int y2,double mean2,double one_over_stddev2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int j;
  long lVar5;
  
  iVar1 = x1 + (y1 + -7) * stride1 + -7;
  iVar2 = x2 + (y2 + -7) * stride2 + -7;
  iVar3 = 0;
  iVar4 = 0;
  do {
    lVar5 = 0;
    do {
      iVar3 = iVar3 + (uint)frame2[iVar2 + (int)lVar5] * (uint)frame1[iVar1 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    iVar4 = iVar4 + 1;
    iVar1 = iVar1 + stride1;
    iVar2 = iVar2 + stride2;
  } while (iVar4 != 0x10);
  return one_over_stddev1 * one_over_stddev2 * ((double)iVar3 - mean1 * mean2);
}

Assistant:

double aom_compute_correlation_c(const unsigned char *frame1, int stride1,
                                 int x1, int y1, double mean1,
                                 double one_over_stddev1,
                                 const unsigned char *frame2, int stride2,
                                 int x2, int y2, double mean2,
                                 double one_over_stddev2) {
  int v1, v2;
  int cross = 0;
  for (int i = 0; i < MATCH_SZ; ++i) {
    for (int j = 0; j < MATCH_SZ; ++j) {
      v1 = frame1[(i + y1 - MATCH_SZ_BY2) * stride1 + (j + x1 - MATCH_SZ_BY2)];
      v2 = frame2[(i + y2 - MATCH_SZ_BY2) * stride2 + (j + x2 - MATCH_SZ_BY2)];
      cross += v1 * v2;
    }
  }

  // Note: In theory, the calculations here "should" be
  //   covariance = cross / N^2 - mean1 * mean2
  //   correlation = covariance / (stddev1 * stddev2).
  //
  // However, because of the scaling in aom_compute_mean_stddev, the
  // lines below actually calculate
  //   covariance * N^2 = cross - (mean1 * N) * (mean2 * N)
  //   correlation = (covariance * N^2) / ((stddev1 * N) * (stddev2 * N))
  //
  // ie. we have removed the need for a division, and still end up with the
  // correct unscaled correlation (ie, in the range [-1, +1])
  double covariance = cross - mean1 * mean2;
  double correlation = covariance * (one_over_stddev1 * one_over_stddev2);
  return correlation;
}